

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int aes_cbc_encrypt(aes_context *ctx,uint8_t *iv,uint8_t *input,size_t length,uint8_t *output)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = -1;
  if ((length & 0xf) == 0) {
    if (length != 0) {
      do {
        lVar3 = 0;
        do {
          output[lVar3] = iv[lVar3] ^ input[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x10);
        aes_encrypt(ctx,output,output);
        uVar1 = *(undefined8 *)(output + 8);
        *(undefined8 *)iv = *(undefined8 *)output;
        *(undefined8 *)(iv + 8) = uVar1;
        input = input + 0x10;
        output = output + 0x10;
        length = length - 0x10;
      } while (length != 0);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int aes_cbc_encrypt(const aes_context* ctx, uint8_t iv[16], const uint8_t* input, size_t length, uint8_t* output) {
    int i;

    if (length % 16)
        return -1;
    while (length > 0) {
        for (i = 0; i < 16; i++)
            output[i] = (unsigned char)(input[i] ^ iv[i]);

        aes_ecb_encrypt(ctx, output, output);
        memcpy(iv, output, 16);

        input += 16;
        output += 16;
        length -= 16;
    }
    return 0;
}